

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_esni_dispose_context(ptls_esni_context_t *esni)

{
  _func_int_st_ptls_key_exchange_context_t_ptr_ptr_int_ptls_iovec_t_ptr_ptls_iovec_t *p_Var1;
  ptls_key_exchange_context_t **pppVar2;
  ptls_iovec_t pVar3;
  long local_18;
  size_t i;
  ptls_esni_context_t *esni_local;
  
  if (esni->key_exchanges != (ptls_key_exchange_context_t **)0x0) {
    for (local_18 = 0; esni->key_exchanges[local_18] != (ptls_key_exchange_context_t *)0x0;
        local_18 = local_18 + 1) {
      p_Var1 = esni->key_exchanges[local_18]->on_exchange;
      pppVar2 = esni->key_exchanges;
      pVar3 = ptls_iovec_init((void *)0x0,0);
      (*p_Var1)(pppVar2 + local_18,1,(ptls_iovec_t *)0x0,pVar3);
    }
    free(esni->key_exchanges);
  }
  free(esni->cipher_suites);
  return;
}

Assistant:

void ptls_esni_dispose_context(ptls_esni_context_t *esni)
{
    size_t i;

    if (esni->key_exchanges != NULL) {
        for (i = 0; esni->key_exchanges[i] != NULL; ++i)
            esni->key_exchanges[i]->on_exchange(esni->key_exchanges + i, 1, NULL, ptls_iovec_init(NULL, 0));
        free(esni->key_exchanges);
    }
    free(esni->cipher_suites);
}